

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O1

void duckdb::FiltersNullValues
               (LogicalType *type,TableFilter *filter,bool *filters_nulls,bool *filters_valid_values
               ,TableFilterState *filter_state)

{
  string sVar1;
  bool bVar2;
  ConjunctionOrFilter *pCVar3;
  ConjunctionAndFilter *pCVar4;
  const_reference pvVar5;
  type pTVar6;
  reference pvVar7;
  type pTVar8;
  ExpressionFilter *this;
  InternalException *this_00;
  size_type sVar9;
  bool child_filters_valid_values;
  bool child_filters_nulls;
  bool local_99;
  vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
  *local_98;
  LogicalType *local_90;
  Value local_88;
  LogicalType local_48;
  
  *filters_nulls = false;
  *filters_valid_values = false;
  local_90 = type;
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
  case IS_NOT_NULL:
    *filters_nulls = true;
    break;
  case IS_NULL:
    *filters_valid_values = true;
    break;
  case CONJUNCTION_OR:
    pCVar3 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    *filters_nulls = true;
    *filters_valid_values = true;
    if ((pCVar3->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar3->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_98 = &(pCVar3->super_ConjunctionFilter).child_filters;
      sVar9 = 0;
      do {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                 ::operator[](local_98,sVar9);
        pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(pvVar5);
        pvVar7 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                               *)(filter_state + 1),sVar9);
        pTVar8 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                 ::operator*(pvVar7);
        FiltersNullValues(local_90,pTVar6,(bool *)&local_88,&local_99,pTVar8);
        sVar1 = (string)local_88.type_.id_;
        if (*filters_nulls == false) {
          sVar1 = (string)0x0;
        }
        *filters_nulls = (bool)sVar1;
        bVar2 = local_99;
        if (*filters_valid_values == false) {
          bVar2 = false;
        }
        *filters_valid_values = bVar2;
        sVar9 = sVar9 + 1;
      } while (sVar9 < (ulong)((long)(pCVar3->super_ConjunctionFilter).child_filters.
                                     super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar3->super_ConjunctionFilter).child_filters.
                                     super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    break;
  case CONJUNCTION_AND:
    pCVar4 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    *filters_nulls = false;
    *filters_valid_values = false;
    if ((pCVar4->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar4->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_98 = &(pCVar4->super_ConjunctionFilter).child_filters;
      sVar9 = 0;
      do {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                 ::operator[](local_98,sVar9);
        pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(pvVar5);
        pvVar7 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                               *)(filter_state + 1),sVar9);
        pTVar8 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                 ::operator*(pvVar7);
        FiltersNullValues(local_90,pTVar6,(bool *)&local_88,&local_99,pTVar8);
        sVar1 = (string)local_88.type_.id_;
        if (*filters_nulls != false) {
          sVar1 = (string)0x1;
        }
        *filters_nulls = (bool)sVar1;
        bVar2 = local_99;
        if (*filters_valid_values != false) {
          bVar2 = true;
        }
        *filters_valid_values = bVar2;
        sVar9 = sVar9 + 1;
      } while (sVar9 < (ulong)((long)(pCVar4->super_ConjunctionFilter).child_filters.
                                     super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar4->super_ConjunctionFilter).child_filters.
                                     super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_88.type_._0_8_ = (long)&local_88 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"FIXME: unsupported type for filter selection in validity select"
               ,"");
    InternalException::InternalException(this_00,(string *)&local_88);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case OPTIONAL_FILTER:
    break;
  case EXPRESSION_FILTER:
    this = TableFilter::Cast<duckdb::ExpressionFilter>(filter);
    LogicalType::LogicalType(&local_48,local_90);
    Value::Value(&local_88,&local_48);
    LogicalType::~LogicalType(&local_48);
    bVar2 = ExpressionFilter::EvaluateWithConstant
                      (this,(ExpressionExecutor *)(filter_state + 1),&local_88);
    *filters_nulls = bVar2;
    *filters_valid_values = false;
    Value::~Value(&local_88);
  }
  return;
}

Assistant:

void FiltersNullValues(const LogicalType &type, const TableFilter &filter, bool &filters_nulls,
                       bool &filters_valid_values, TableFilterState &filter_state) {
	filters_nulls = false;
	filters_valid_values = false;

	switch (filter.filter_type) {
	case TableFilterType::OPTIONAL_FILTER:
		break;
	case TableFilterType::CONJUNCTION_OR: {
		auto &conjunction_or = filter.Cast<ConjunctionOrFilter>();
		auto &state = filter_state.Cast<ConjunctionOrFilterState>();
		filters_nulls = true;
		filters_valid_values = true;
		for (idx_t child_idx = 0; child_idx < conjunction_or.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction_or.child_filters[child_idx];
			auto &child_state = *state.child_states[child_idx];
			bool child_filters_nulls, child_filters_valid_values;
			FiltersNullValues(type, child_filter, child_filters_nulls, child_filters_valid_values, child_state);
			filters_nulls = filters_nulls && child_filters_nulls;
			filters_valid_values = filters_valid_values && child_filters_valid_values;
		}
		break;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and = filter.Cast<ConjunctionAndFilter>();
		auto &state = filter_state.Cast<ConjunctionAndFilterState>();
		filters_nulls = false;
		filters_valid_values = false;
		for (idx_t child_idx = 0; child_idx < conjunction_and.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction_and.child_filters[child_idx];
			auto &child_state = *state.child_states[child_idx];
			bool child_filters_nulls, child_filters_valid_values;
			FiltersNullValues(type, child_filter, child_filters_nulls, child_filters_valid_values, child_state);
			filters_nulls = filters_nulls || child_filters_nulls;
			filters_valid_values = filters_valid_values || child_filters_valid_values;
		}
		break;
	}
	case TableFilterType::CONSTANT_COMPARISON:
		filters_nulls = true;
		break;
	case TableFilterType::IS_NULL:
		filters_valid_values = true;
		break;
	case TableFilterType::IS_NOT_NULL:
		filters_nulls = true;
		break;
	case TableFilterType::EXPRESSION_FILTER: {
		auto &expr_filter = filter.Cast<ExpressionFilter>();
		auto &state = filter_state.Cast<ExpressionFilterState>();
		Value val(type);
		filters_nulls = expr_filter.EvaluateWithConstant(state.executor, val);
		filters_valid_values = false;
		break;
	}
	default:
		throw InternalException("FIXME: unsupported type for filter selection in validity select");
	}
}